

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gedung.h
# Opt level: O2

void __thiscall Jalan::print(Jalan *this,FrameBuffer *fb)

{
  Shape::print(&this->jalanparkiran->super_Shape,fb);
  Shape::print(&this->jalanparkiranbelakang->super_Shape,fb);
  Shape::print(&this->jalanparkirankekiri->super_Shape,fb);
  Shape::print(&this->jalanparkirankekanan->super_Shape,fb);
  Shape::print(&this->jalanujungkiribelakang->super_Shape,fb);
  Shape::print(&this->jalanujungkiri->super_Shape,fb);
  Shape::print(&this->jalanujungkanan->super_Shape,fb);
  Shape::print(&this->jalankirigku->super_Shape,fb);
  Shape::print(&this->jalanboulevard->super_Shape,fb);
  Shape::print(&this->jalanboulevard1->super_Shape,fb);
  Shape::print(&this->jalanboulevard2->super_Shape,fb);
  Shape::print(&this->jalanboulevard3->super_Shape,fb);
  Shape::print(&this->jalanboulevard4->super_Shape,fb);
  Shape::print(&this->jalanintel->super_Shape,fb);
  Shape::print(&this->jalanmesinmatik->super_Shape,fb);
  Shape::print(&this->jalangkumesin->super_Shape,fb);
  Shape::print(&this->jalangkutokema->super_Shape,fb);
  Shape::print(&this->jalantaman->super_Shape,fb);
  Shape::print(&this->jalansunken->super_Shape,fb);
  Shape::print(&this->jalanseblabtek->super_Shape,fb);
  Shape::print(&this->jalansetlabtek->super_Shape,fb);
  Shape::print(&this->jalansebperpus->super_Shape,fb);
  Shape::print(&this->jalansebgang1->super_Shape,fb);
  Shape::print(&this->jalansebgang2->super_Shape,fb);
  Shape::print(&this->jalansebgang3->super_Shape,fb);
  Shape::print(&this->gangkanan->super_Shape,fb);
  return;
}

Assistant:

void print(FrameBuffer& fb){
    jalanparkiran->print(fb);
    jalanparkiranbelakang->print(fb);
    jalanparkirankekiri->print(fb);
    jalanparkirankekanan->print(fb);
    jalanujungkiribelakang->print(fb);
    jalanujungkiri->print(fb);
    jalanujungkanan->print(fb);
    jalankirigku->print(fb);
    jalanboulevard->print(fb);
    jalanboulevard1->print(fb);
    jalanboulevard2->print(fb);
    jalanboulevard3->print(fb);
    jalanboulevard4->print(fb);
    jalanintel->print(fb);
    jalanmesinmatik->print(fb);
    jalangkumesin->print(fb);
    jalangkutokema->print(fb);
    jalantaman->print(fb);
    jalansunken->print(fb);
    jalanseblabtek->print(fb);
    jalansetlabtek->print(fb);
    jalansebperpus->print(fb);
    jalansebgang1->print(fb);
    jalansebgang2->print(fb);
    jalansebgang3->print(fb);
    gangkanan->print(fb);
  }